

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testlist.cpp
# Opt level: O2

void __thiscall Testlist::print(Testlist *this)

{
  pointer ppEVar1;
  int i;
  long lVar2;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> list;
  _Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_> _Stack_38;
  
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::vector
            ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&_Stack_38,&this->_list);
  for (lVar2 = 0;
      ppEVar1 = (this->_list).super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(this->_list).
                                  super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3);
      lVar2 = lVar2 + 1) {
    if (lVar2 != 0) {
      std::operator<<((ostream *)&std::cout,", ");
      ppEVar1 = (this->_list).super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    (**ppEVar1[lVar2]->_vptr_ExprNode)();
  }
  std::_Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>::~_Vector_base(&_Stack_38);
  return;
}

Assistant:

void Testlist::print() {
    std::vector<ExprNode*>list = getTestlist();
    for(int i = 0; i < numTests();i++){
        if(i != 0)
            std::cout << ", ";
        at(i)->print();
    }
//    for (auto e: _list) {
//        e->print();
//        std::cout << ", ";
//    }
}